

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.h
# Opt level: O0

bool json_isspace(int ch)

{
  int in_EDI;
  long in_FS_OFFSET;
  bool local_9;
  
  if (((in_EDI - 9U < 2) || (in_EDI == 0xd)) || (in_EDI == 0x20)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return local_9;
}

Assistant:

static inline bool json_isspace(int ch)
{
    switch (ch) {
    case 0x20:
    case 0x09:
    case 0x0a:
    case 0x0d:
        return true;

    default:
        return false;
    }

    // not reached
}